

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::tail(dynamic_string *this,uint num)

{
  uint start;
  uint uVar1;
  uint len;
  
  if (-1 < (int)num) {
    uVar1 = (uint)this->m_len;
    len = num;
    if ((int)uVar1 < (int)num) {
      len = uVar1;
    }
    start = 0;
    if (0 < (int)(uVar1 - num)) {
      start = uVar1 - num;
    }
    crop(this,start,len);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::tail(uint num)
    {
        return substring(math::maximum<int>(static_cast<int>(get_len()) - static_cast<int>(num), 0), get_len());
    }